

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O1

int checkerBig1(void)

{
  ulong uVar1;
  int iVar2;
  FILE *__stream;
  char *__s;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  int p [2501];
  uint local_2748 [2502];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar6 = 0xffffffff;
  }
  else {
    uVar4 = 5000;
    uVar6 = 0;
    do {
      __s = ScanInt((FILE *)__stream,(int *)local_2748);
      bVar9 = true;
      if (__s == "PASSED") {
        if ((uVar6 == local_2748[0] || 0x9c4 < uVar6) && (uVar4 == local_2748[0] || uVar6 < 0x9c5))
        {
          bVar9 = false;
          __s = "PASSED";
        }
        else {
          printf("wrong output -- ");
          __s = "FAILED";
        }
      }
      if (bVar9) break;
      uVar4 = uVar4 - 1;
      bVar9 = uVar6 != 4999;
      uVar6 = uVar6 + 1;
    } while (bVar9);
    if (__s == "PASSED") {
      lVar7 = 0;
      do {
        __s = ScanInt((FILE *)__stream,(int *)((long)local_2748 + lVar7));
        if (__s != "PASSED") break;
        lVar7 = lVar7 + 4;
        __s = "PASSED";
      } while (lVar7 != 0x2714);
      bVar9 = true;
      bVar8 = true;
      if (local_2748[0] == 0x9c5) {
        uVar3 = 0x9c5;
        uVar1 = 0;
        do {
          uVar5 = uVar1;
          if (uVar5 == 0x9c4) break;
          uVar3 = uVar3 - 1;
          uVar1 = uVar5 + 1;
        } while (uVar3 == local_2748[uVar5 + 1]);
        bVar8 = uVar5 < 0x9c4;
      }
      if (local_2748[0] == 0x9c5) {
        uVar1 = 0;
        do {
          uVar3 = uVar1;
          if (uVar3 == 0x9c3) break;
          uVar1 = uVar3 + 1;
        } while (uVar3 + 0x9c6 == (ulong)local_2748[uVar3 + 1]);
        bVar9 = uVar3 < 0x9c3;
      }
      if ((bool)(bVar8 & (local_2748[0x9c4] != 1 | bVar9))) {
        printf("wrong output -- ");
        __s = "FAILED";
      }
    }
    if (__s == "PASSED") {
      iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
      if (iVar2 == 0) {
        __s = "PASSED";
      }
      else {
        __s = "FAILED";
      }
    }
    fclose(__stream);
    puts(__s);
    uVar6 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar6;
}

Assistant:

static int checkerBig1(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    int p[2501], v1 = 1, v2 = 1; // two shortest paths exist
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if ((i <= 2500 && d != i) || (i > 2500 && d != 5000-i)) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        for (i = 0; i < 2501; i++) {
            message = ScanInt(out, &p[i]);
            if (message != Pass) {
                break;
            }
        }
        for (i = 0; i < 2501; i++)
            if (p[i] != 2501-i) { // 2501 2500 2499 ... 1
                v1 = 0;
                break;
            }
        for (i = 0; i < 2500; i++)
            if (p[i] != 2501+i) { // 2501 2502 ... 4999 5000 1
                v2 = 0;
                break;
            }
        if (p[2500] != 1) {
            v2 = 0;
        }
        if (v1 == 0 && v2 == 0) {
            printf("wrong output -- ");
            message = Fail;
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}